

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDefinePropertyCommand.h
# Opt level: O2

cmCommand * __thiscall cmDefinePropertyCommand::Clone(cmDefinePropertyCommand *this)

{
  cmDefinePropertyCommand *this_00;
  
  this_00 = (cmDefinePropertyCommand *)operator_new(0xb0);
  cmDefinePropertyCommand(this_00);
  return &this_00->super_cmCommand;
}

Assistant:

virtual cmCommand* Clone()
    {
      return new cmDefinePropertyCommand;
    }